

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

void __thiscall icu_63::VTimeZone::writeFooter(VTimeZone *this,VTZWriter *writer,UErrorCode *status)

{
  UBool UVar1;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  UErrorCode *status_local;
  VTZWriter *writer_local;
  VTimeZone *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    VTZWriter::write(writer,0x428172,__buf,in_RCX);
    VTZWriter::write(writer,0x3a,__buf_00,in_RCX);
    VTZWriter::write(writer,0x4280f0,__buf_01,in_RCX);
    VTZWriter::write(writer,0x4281ee,__buf_02,in_RCX);
  }
  return;
}

Assistant:

void
VTimeZone::writeFooter(VTZWriter& writer, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    writer.write(ICAL_END);
    writer.write(COLON);
    writer.write(ICAL_VTIMEZONE);
    writer.write(ICAL_NEWLINE);
}